

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::run_callback(App *this)

{
  pointer psVar1;
  App *this_00;
  size_t sVar2;
  shared_ptr<CLI::App> *subc;
  pointer psVar3;
  pointer ppAVar4;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_30;
  
  (*this->_vptr_App[2])();
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_30,&this->parsed_subcommands_)
  ;
  for (ppAVar4 = local_30.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar4 !=
      local_30.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar4 = ppAVar4 + 1) {
    if ((*ppAVar4)->immediate_callback_ == false) {
      run_callback(*ppAVar4);
    }
  }
  if (local_30.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    this_00 = (psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((this_00->immediate_callback_ == false) && ((this_00->name_)._M_string_length == 0)) &&
       (sVar2 = count_all(this_00), sVar2 != 0)) {
      run_callback((psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
  }
  if (((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (this->parsed_ != 0)) {
    if (((this->name_)._M_string_length == 0) && (sVar2 = count_all(this), sVar2 == 0)) {
      return;
    }
    if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_);
  }
  return;
}

Assistant:

void run_callback() {
        pre_callback();
        // run the callbacks for the received subcommands
        for(App *subc : get_subcommands()) {
            if(!subc->immediate_callback_)
                subc->run_callback();
        }
        // now run callbacks for option_groups
        for(auto &subc : subcommands_) {
            if(!subc->immediate_callback_ && subc->name_.empty() && subc->count_all() > 0) {
                subc->run_callback();
            }
        }
        // finally run the main callback
        if(callback_ && (parsed_ > 0)) {
            if(!name_.empty() || count_all() > 0) {
                callback_();
            }
        }
    }